

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

BOOL Js::JavascriptOperators::SetElementIHelper
               (Var receiver,RecyclableObject *object,Var index,Var value,
               ScriptContext *scriptContext,PropertyOperationFlags flags)

{
  code *pcVar1;
  PropertyRecordUsageCache *propertyString;
  bool bVar2;
  uint uVar3;
  IndexType IVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var indexVar;
  undefined4 in_register_0000008c;
  JavascriptString *pJVar7;
  PropertyValueInfo local_b0;
  RecyclableObject *local_70;
  RecyclableObject *cacheOwner;
  PropertyRecordUsageCache *propertyRecordUsageCache;
  JavascriptString *propertyNameString;
  undefined8 local_50;
  PropertyRecord *local_48;
  PropertyRecord *propertyRecord;
  RecyclableObject *pRStack_38;
  uint32 indexVal;
  
  local_50 = CONCAT44(in_register_0000008c,flags);
  propertyRecord._4_4_ = 0;
  local_48 = (PropertyRecord *)0x0;
  propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  bVar2 = GetPropertyRecordUsageCache
                    (index,scriptContext,(PropertyRecordUsageCache **)&cacheOwner,&local_70);
  if (bVar2) {
    bVar2 = SetElementIWithCache<false>
                      (receiver,object,local_70,value,(PropertyRecordUsageCache *)cacheOwner,
                       scriptContext,(PropertyOperationFlags)local_50,
                       (PropertyCacheOperationInfo *)0x0);
LAB_00abdba8:
    return (uint)bVar2;
  }
  pRStack_38 = object;
  bVar2 = VarIs<Js::RecyclableObject>(receiver);
  if (!bVar2) {
    bVar2 = SetElementIOnTaggedNumber
                      (receiver,pRStack_38,index,value,scriptContext,
                       (PropertyOperationFlags)local_50);
    goto LAB_00abdba8;
  }
  propertyNameString = (JavascriptString *)value;
  if (((ulong)index & 0x1ffff00000000) != 0x1000000000000 &&
      ((ulong)index & 0xffff000000000000) == 0x1000000000000) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
    if (!bVar2) goto LAB_00abdd1b;
    *puVar6 = 0;
  }
  uVar3 = 0;
  if (((ulong)index & 0xffff000000000000) != 0x1000000000000) {
    bVar2 = VarIs<Js::JavascriptString>(index);
    uVar3 = (uint)bVar2;
  }
  scriptContext->forinNoCache = scriptContext->forinNoCache + uVar3;
  indexVar = JavascriptConversion::ToPrimitive<(Js::JavascriptHint)1>(index,scriptContext);
  IVar4 = GetIndexTypeFromPrimitive
                    (indexVar,scriptContext,(uint32 *)((long)&propertyRecord + 4),&local_48,
                     (JavascriptString **)&propertyRecordUsageCache,false,true);
  propertyString = propertyRecordUsageCache;
  if (((scriptContext->threadContext->disableImplicitFlags & DisableImplicitCallFlag) !=
       DisableImplicitNoFlag) &&
     (scriptContext->threadContext->implicitCallFlags != ImplicitCall_None)) {
    return 0;
  }
  if (IVar4 == IndexType_JavascriptString) {
    if (propertyRecordUsageCache == (PropertyRecordUsageCache *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                  ,0x12c3,"(propertyNameString)","propertyNameString");
      if (!bVar2) goto LAB_00abdd1b;
      *puVar6 = 0;
    }
    if ((local_48 == (PropertyRecord *)0x0) &&
       (ScriptContext::GetOrAddPropertyRecord
                  (scriptContext,(JavascriptString *)propertyString,&local_48),
       pJVar7 = propertyNameString, local_48->isNumeric == true)) {
      propertyRecord._4_4_ = PropertyRecord::GetNumericValue(local_48);
      goto LAB_00abdb6f;
    }
  }
  else {
    pJVar7 = propertyNameString;
    if (IVar4 == IndexType_Number) {
LAB_00abdb6f:
      BVar5 = SetItem(receiver,pRStack_38,propertyRecord._4_4_,pJVar7,scriptContext,
                      (PropertyOperationFlags)local_50,0);
      return BVar5;
    }
  }
  pJVar7 = propertyNameString;
  if (local_48 == (PropertyRecord *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x12d5,"(propertyRecord)","propertyRecord");
    if (!bVar2) {
LAB_00abdd1b:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar6 = 0;
  }
  local_b0.m_instance = (RecyclableObject *)0x0;
  local_b0.m_propertyIndex = 0xffff;
  local_b0.m_attributes = '\0';
  local_b0.flags = InlineCacheNoFlags;
  local_b0.cacheInfoFlag = defaultInfoFlags;
  local_b0.inlineCache = (InlineCache *)0x0;
  local_b0.polymorphicInlineCache = (PolymorphicInlineCache *)0x0;
  local_b0.functionBody = (FunctionBody *)0x0;
  local_b0.prop = (RecyclableObject *)0x0;
  local_b0.propertyRecordUsageCache = (PropertyRecordUsageCache *)0x0;
  local_b0.inlineCacheIndex = 0xffffffff;
  local_b0.allowResizingPolymorphicInlineCache = true;
  BVar5 = SetProperty_Internal<false>
                    (receiver,pRStack_38,false,local_48->pid,pJVar7,&local_b0,scriptContext,
                     (PropertyOperationFlags)local_50);
  return BVar5;
}

Assistant:

BOOL JavascriptOperators::SetElementIHelper(Var receiver, RecyclableObject* object, Var index, Var value, ScriptContext* scriptContext, PropertyOperationFlags flags)
    {
        IndexType indexType;
        uint32 indexVal = 0;
        PropertyRecord const * propertyRecord = nullptr;
        JavascriptString * propertyNameString = nullptr;
        PropertyValueInfo propertyValueInfo;

        RecyclableObject* cacheOwner;
        PropertyRecordUsageCache* propertyRecordUsageCache;
        if (JavascriptOperators::GetPropertyRecordUsageCache(index, scriptContext, &propertyRecordUsageCache, &cacheOwner))
        {
            return JavascriptOperators::SetElementIWithCache<false>(receiver, object, cacheOwner, value, propertyRecordUsageCache, scriptContext, flags, nullptr);
        }

        if (TaggedNumber::Is(receiver))
        {
            return JavascriptOperators::SetElementIOnTaggedNumber(receiver, object, index, value, scriptContext, flags);
        }

#if DBG_DUMP
        scriptContext->forinNoCache += (!TaggedInt::Is(index) && VarIs<JavascriptString>(index));
#endif
        indexType = GetIndexType(index, scriptContext, &indexVal, &propertyRecord, &propertyNameString, false, true);
        if (scriptContext->GetThreadContext()->IsDisableImplicitCall() &&
            scriptContext->GetThreadContext()->GetImplicitCallFlags() != ImplicitCall_None)
        {
            // We hit an implicit call trying to convert the index, and implicit calls are disabled, so
            // quit before we try to store the element.
            return FALSE;
        }

        if (indexType == IndexType_Number)
        {
SetElementIHelper_INDEX_TYPE_IS_NUMBER:
            return JavascriptOperators::SetItem(receiver, object, indexVal, value, scriptContext, flags);
        }
        else if (indexType == IndexType_JavascriptString)
        {
            Assert(propertyNameString);

            // At this point, we know that the propertyNameString is neither PropertyString
            // or LiteralStringWithPropertyStringPtr.. Get PropertyRecord!
            // we will get it anyways otherwise. (Also, 1:1 string comparison for Builtin types will be expensive.)

            if (propertyRecord == nullptr)
            {
                scriptContext->GetOrAddPropertyRecord(propertyNameString, &propertyRecord);
                if (propertyRecord->IsNumeric())
                {
                    indexVal = propertyRecord->GetNumericValue();
                    goto SetElementIHelper_INDEX_TYPE_IS_NUMBER;
                }
            }
        }

        Assert(indexType == IndexType_PropertyId || indexType == IndexType_JavascriptString);
        Assert(propertyRecord);
        return JavascriptOperators::SetProperty(receiver, object, propertyRecord->GetPropertyId(), value, scriptContext, flags);
    }